

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O3

void Ivy_GraphUpdateNetworkSeq(Ivy_Man_t *p,Ivy_Obj_t *pRoot,Dec_Graph_t *pGraph,int nGain)

{
  int iVar1;
  int iVar2;
  Dec_Node_t *pDVar3;
  Dec_Node_t *pDVar4;
  uint uVar5;
  Ivy_Obj_t *pIVar6;
  Dec_Edge_t DVar7;
  uint uVar8;
  ulong uVar9;
  Ivy_Obj_t *pObj;
  
  iVar1 = p->nObjs[5];
  iVar2 = p->nObjs[6];
  DVar7 = pGraph->eRoot;
  if (pGraph->fConst == 0) {
    uVar9 = (ulong)(uint)pGraph->nLeaves;
    uVar5 = (uint)DVar7 >> 1 & 0x3fffffff;
    if (uVar5 < (uint)pGraph->nLeaves) {
      pDVar3 = pGraph->pNodes;
      pIVar6 = (Ivy_Obj_t *)pDVar3[uVar5].field_2.pFunc;
      if (*(uint *)&pDVar3[uVar5].field_0x10 < 0x8000000) goto LAB_007fae88;
      uVar8 = 0;
      do {
        pIVar6 = Ivy_Latch(p,pIVar6,IVY_INIT_DC);
        pDVar3[uVar5].field_2.pFunc = pIVar6;
        uVar8 = uVar8 + 1;
      } while (uVar8 < *(uint *)&pDVar3[uVar5].field_0x10 >> 0x1b);
    }
    else {
      do {
        pDVar4 = pGraph->pNodes;
        pDVar3 = pDVar4 + uVar9;
        pIVar6 = (Ivy_Obj_t *)
                 ((ulong)((uint)pDVar3->eEdge0 & 1) ^
                 (ulong)pDVar4[(uint)pDVar3->eEdge0 >> 1 & 0x3fffffff].field_2.pFunc);
        pObj = (Ivy_Obj_t *)
               ((ulong)((uint)pDVar3->eEdge1 & 1) ^
               (ulong)pDVar4[(uint)pDVar3->eEdge1 >> 1 & 0x3fffffff].field_2.pFunc);
        uVar5 = *(uint *)&pDVar3->field_0x10;
        if ((uVar5 & 0x3e0000) != 0) {
          uVar8 = 0;
          do {
            pIVar6 = Ivy_Latch(p,pIVar6,IVY_INIT_DC);
            uVar8 = uVar8 + 1;
            uVar5 = *(uint *)&pDVar3->field_0x10;
          } while (uVar8 < (uVar5 >> 0x11 & 0x1f));
        }
        if ((uVar5 & 0x7c00000) != 0) {
          uVar5 = 0;
          do {
            pObj = Ivy_Latch(p,pObj,IVY_INIT_DC);
            uVar5 = uVar5 + 1;
          } while (uVar5 < (*(uint *)&pDVar3->field_0x10 >> 0x16 & 0x1f));
        }
        pIVar6 = Ivy_And(p,pIVar6,pObj);
        (pDVar3->field_2).pFunc = pIVar6;
        uVar9 = uVar9 + 1;
      } while ((long)uVar9 < (long)pGraph->nSize);
      if (0x7ffffff < *(uint *)&pDVar3->field_0x10) {
        uVar5 = 0;
        do {
          pIVar6 = Ivy_Latch(p,pIVar6,IVY_INIT_DC);
          (pDVar3->field_2).pFunc = pIVar6;
          uVar5 = uVar5 + 1;
        } while (uVar5 < *(uint *)&pDVar3->field_0x10 >> 0x1b);
      }
    }
    DVar7 = pGraph->eRoot;
  }
  else {
    pIVar6 = p->pConst1;
  }
LAB_007fae88:
  Ivy_ObjReplace(p,pRoot,(Ivy_Obj_t *)((ulong)((uint)DVar7 & 1) ^ (ulong)pIVar6),1,0,0);
  if ((iVar2 + iVar1) - (p->nObjs[5] + p->nObjs[6]) < nGain) {
    __assert_fail("nGain <= nNodesOld - nNodesNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivySeq.c"
                  ,0x218,
                  "void Ivy_GraphUpdateNetworkSeq(Ivy_Man_t *, Ivy_Obj_t *, Dec_Graph_t *, int)");
  }
  Ivy_ManPropagateBuffers(p,0);
  return;
}

Assistant:

void Ivy_GraphUpdateNetworkSeq( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Dec_Graph_t * pGraph, int nGain )
{
    Ivy_Obj_t * pRootNew;
    int nNodesNew, nNodesOld;
    nNodesOld = Ivy_ManNodeNum(p);
    // create the new structure of nodes
    pRootNew = Ivy_GraphToNetworkSeq( p, pGraph );
    Ivy_ObjReplace( p, pRoot, pRootNew, 1, 0, 0 );
    // compare the gains
    nNodesNew = Ivy_ManNodeNum(p);
    assert( nGain <= nNodesOld - nNodesNew );
    // propagate the buffer
    Ivy_ManPropagateBuffers( p, 0 );
}